

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAnnotation.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSAnnotation::XSAnnotation(XSAnnotation *this,XMLCh *content,MemoryManager *manager)

{
  XMLCh *pXVar1;
  MemoryManager *manager_local;
  XMLCh *content_local;
  XSAnnotation *this_local;
  
  XSerializable::XSerializable(&this->super_XSerializable);
  XSObject::XSObject(&this->super_XSObject,ANNOTATION,(XSModel *)0x0,manager);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XSAnnotation_0052d988;
  (this->super_XSObject)._vptr_XSObject = (_func_int **)&DAT_0052d9c0;
  pXVar1 = XMLString::replicate(content,manager);
  this->fContents = pXVar1;
  this->fNext = (XSAnnotation *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fLine = 0;
  this->fCol = 0;
  return;
}

Assistant:

XSAnnotation::XSAnnotation(const XMLCh*          const content,
                                 MemoryManager * const manager)
:XSObject(XSConstants::ANNOTATION, 0, manager)
,fContents(XMLString::replicate(content, manager))
,fNext(0)
,fSystemId(0)
,fLine(0)
,fCol(0)
{
}